

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void duckdb::SerializeDecimalArithmetic
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               ScalarFunction *function)

{
  FunctionData *pFVar1;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  
  bind_data_p_local = bind_data_p;
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  Serializer::WriteProperty<bool>(serializer,100,"check_overflow",(bool *)(pFVar1 + 1));
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,0x65,"return_type",&(function->super_BaseScalarFunction).return_type);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x66,"arguments",
             &(function->super_BaseScalarFunction).super_SimpleFunction.arguments);
  return;
}

Assistant:

static void SerializeDecimalArithmetic(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                       const ScalarFunction &function) {
	auto &bind_data = bind_data_p->Cast<DecimalArithmeticBindData>();
	serializer.WriteProperty(100, "check_overflow", bind_data.check_overflow);
	serializer.WriteProperty(101, "return_type", function.return_type);
	serializer.WriteProperty(102, "arguments", function.arguments);
}